

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O0

UNormalizationCheckResult unorm_getQuickCheck_63(UChar32 c,UNormalizationMode mode)

{
  UBool UVar1;
  Normalizer2 *pNVar2;
  Normalizer2 *norm2;
  UErrorCode errorCode;
  UNormalizationMode mode_local;
  UChar32 c_local;
  
  if (((int)mode < 2) || (5 < (int)mode)) {
    mode_local = UNORM_NONE;
  }
  else {
    norm2._0_4_ = U_ZERO_ERROR;
    norm2._4_4_ = mode;
    errorCode = c;
    pNVar2 = icu_63::Normalizer2Factory::getInstance(mode,(UErrorCode *)&norm2);
    UVar1 = U_SUCCESS((UErrorCode)norm2);
    if (UVar1 == '\0') {
      mode_local = UNORM_NFD;
    }
    else {
      mode_local = (*(pNVar2->super_UObject)._vptr_UObject[0x15])(pNVar2,(ulong)(uint)errorCode);
    }
  }
  return mode_local;
}

Assistant:

U_CFUNC UNormalizationCheckResult
unorm_getQuickCheck(UChar32 c, UNormalizationMode mode) {
    if(mode<=UNORM_NONE || UNORM_FCD<=mode) {
        return UNORM_YES;
    }
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *norm2=Normalizer2Factory::getInstance(mode, errorCode);
    if(U_SUCCESS(errorCode)) {
        return ((const Normalizer2WithImpl *)norm2)->getQuickCheck(c);
    } else {
        return UNORM_MAYBE;
    }
}